

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

string * __thiscall
viface::utils::hexdump_abi_cxx11_
          (string *__return_storage_ptr__,utils *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  ostringstream buff;
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buff);
  iVar9 = (int)*(undefined8 *)(this + 8) - (int)*(undefined8 *)this;
  for (lVar6 = 0; lVar6 < iVar9; lVar6 = lVar6 + 0x10) {
    *(uint *)((long)auStack_190 + *(long *)(_buff + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_buff + -0x18)) & 0xffffff4f | 0x80;
    poVar4 = std::operator<<((ostringstream *)&buff,0x30);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar6);
    std::operator<<(poVar4,"  ");
    *(uint *)((long)auStack_190 + *(long *)(_buff + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_buff + -0x18)) & 0xffffffb5 | 8;
    lVar7 = 0x10;
    lVar5 = lVar6;
    while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
      pcVar8 = "   ";
      if ((int)lVar5 < iVar9) {
        bVar1 = *(byte *)(*(long *)this + lVar5);
        poVar4 = std::operator<<((ostringstream *)&buff,0x30);
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
        std::ostream::operator<<(poVar4,(uint)bVar1);
        pcVar8 = " ";
      }
      std::operator<<((ostream *)&buff,pcVar8);
      lVar5 = lVar5 + 1;
    }
    *(uint *)((long)auStack_190 + *(long *)(_buff + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_buff + -0x18)) & 0xffffffb5 | 2;
    std::operator<<((ostream *)&buff," ");
    lVar7 = 0x10;
    lVar5 = lVar6;
    while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
      if ((int)lVar5 < iVar9) {
        cVar2 = *(char *)(*(long *)this + lVar5);
        iVar3 = isprint((int)cVar2);
        if (iVar3 == 0) {
          std::operator<<((ostream *)&buff,".");
        }
        else {
          std::operator<<((ostream *)&buff,cVar2);
        }
      }
      lVar5 = lVar5 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&buff);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buff);
  return __return_storage_ptr__;
}

Assistant:

string hexdump(vector<uint8_t> const& bytes)
{
    ostringstream buff;

    int buflen = bytes.size();

    int i;
    int j;
    char c;

    for (i = 0, j = 0; i < buflen; i += 16) {
        // Print offset
        buff << right << setfill('0') << setw(4) << i << "  ";

        // Print bytes in hexadecimal
        buff << hex;
        for (j = 0; j < 16; j++) {
            if (i + j < buflen) {
                c = bytes[i + j];
                buff << setfill('0') << setw(2) << (int(c) & 0xFF);
                buff << " ";
            } else {
                buff << "   ";
            }
        }
        buff << dec;
        buff << " ";

        // Print printable characters
        for (j = 0; j < 16; j++) {
            if (i + j < buflen) {
                c = bytes[i + j];
                if (isprint(c)) {
                    buff << c;
                } else {
                    buff << ".";
                }
            }
        }
        buff << endl;
    }
    return buff.str();
}